

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O2

void __thiscall libtorrent::http_stream::handshake1(http_stream *this,error_code *e,handler_type *h)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  bool bVar3;
  mutable_buffers_1 local_60;
  _Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
  local_50;
  
  bVar3 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (!bVar3) {
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,1);
    pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_60.super_mutable_buffer.size_ =
         (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pcVar1;
    local_60.super_mutable_buffer.data_ = (pointer)0x0;
    if (local_60.super_mutable_buffer.size_ != 0) {
      local_60.super_mutable_buffer.data_ = pcVar1;
    }
    local_50._M_f = (offset_in_http_stream_to_subr)handshake2;
    local_50._8_8_ = 0;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._8_8_ = 0;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl._M_invoker = h->_M_invoker;
    p_Var2 = (h->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(h->super__Function_base)._M_functor;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_functor._8_8_ =
           *(undefined8 *)((long)&(h->super__Function_base)._M_functor + 8);
      (h->super__Function_base)._M_manager = (_Manager_type)0x0;
      h->_M_invoker = (_Invoker_type)0x0;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_manager = p_Var2;
    }
    local_50._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Head_base<0UL,_libtorrent::http_stream_*,_false>._M_head_impl = this;
    boost::asio::
    async_read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(libtorrent::http_stream::*(libtorrent::http_stream*,std::_Placeholder<1>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&)>>
              ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)this,&local_60,&local_50,(type *)0x0);
    std::_Function_base::~_Function_base((_Function_base *)&local_50._M_bound_args);
  }
  return;
}

Assistant:

void http_stream::handshake1(error_code const& e, handler_type& h)
	{
		if (handle_error(e, h)) return;

		// read one byte from the socket
		m_buffer.resize(1);
		async_read(m_sock, boost::asio::buffer(m_buffer)
			, std::bind(&http_stream::handshake2, this, _1, std::move(h)));
	}